

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eimgfs.cpp
# Opt level: O0

void __thiscall
filesystemcollection::addfs(filesystemcollection *this,FileContainer_ptr *fs,string *name)

{
  undefined8 uVar1;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FileContainer>_>_>,_bool>
  pVar2;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FileContainer>_>
  local_60;
  _Base_ptr local_30;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FileContainer>_>_>,_bool>
  ins;
  string *name_local;
  FileContainer_ptr *fs_local;
  filesystemcollection *this_local;
  
  ins._8_8_ = name;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FileContainer>_>
  ::pair<std::shared_ptr<FileContainer>_&,_true>(&local_60,name,fs);
  pVar2 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FileContainer>,_caseinsensitive,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FileContainer>_>_>_>
          ::insert(&this->_byname,&local_60);
  local_30 = (_Base_ptr)pVar2.first._M_node;
  ins.first._M_node._0_1_ = pVar2.second;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FileContainer>_>
  ::~pair(&local_60);
  if (((byte)ins.first._M_node & 1) == 0) {
    uVar1 = std::__cxx11::string::c_str();
    printf("WARNING: duplicate filesystem name %s\n",uVar1);
  }
  return;
}

Assistant:

void addfs(FileContainer_ptr fs, const std::string& name)
    {
        auto ins= _byname.insert(fsmap_t::value_type(name, fs));
        if (!ins.second) {
            printf("WARNING: duplicate filesystem name %s\n", name.c_str());
        }
    }